

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,UL *WrappingUL)

{
  long lVar1;
  bool bVar2;
  byte_t *pbVar3;
  _Self local_98;
  _Self local_90;
  iterator sdli;
  undefined1 local_68 [8];
  UL CryptEssenceUL;
  undefined1 local_38 [8];
  UL GenericContainerUL;
  UL *WrappingUL_local;
  TrackFileWriter<ASDCP::MXF::OP1aHeader> *this_local;
  
  GenericContainerUL.super_Identifier<16U>._24_8_ = WrappingUL;
  UL::operator=((UL *)(this->m_EssenceDescriptor + 0x108),WrappingUL);
  optional_property<Kumu::UUID>::operator=
            ((optional_property<Kumu::UUID> *)(*(long *)&this->field_0x260 + 200),
             (UUID *)(this->m_FilePackage + 0x58));
  if (this->m_Dict != (Dictionary *)0x0) {
    pbVar3 = Dictionary::ul(this->m_Dict,MDD_GCMulti);
    UL::UL((UL *)local_38,pbVar3);
    PushSet<ASDCP::UL>::push_back((PushSet<ASDCP::UL> *)&this->field_0x138,(UL *)local_38);
    if (((this->m_Info).EncryptedEssence & 1U) == 0) {
      PushSet<ASDCP::UL>::push_back
                ((PushSet<ASDCP::UL> *)&this->field_0x138,
                 (UL *)GenericContainerUL.super_Identifier<16U>._24_8_);
    }
    else {
      pbVar3 = Dictionary::ul(this->m_Dict,MDD_EncryptedContainerLabel);
      UL::UL((UL *)local_68,pbVar3);
      PushSet<ASDCP::UL>::push_back((PushSet<ASDCP::UL> *)&this->field_0x138,(UL *)local_68);
      lVar1 = *(long *)&this->field_0x260;
      pbVar3 = Dictionary::ul(this->m_Dict,MDD_CryptographicFrameworkLabel);
      UL::UL((UL *)&sdli,pbVar3);
      PushSet<ASDCP::UL>::push_back((PushSet<ASDCP::UL> *)(lVar1 + 400),(UL *)&sdli);
      UL::~UL((UL *)&sdli);
      ASDCP::AddDmsCrypt((Partition *)&this->m_HeaderPart,this->m_FilePackage,&this->m_Info,
                         (UL *)GenericContainerUL.super_Identifier<16U>._24_8_,this->m_Dict);
      UL::~UL((UL *)local_68);
    }
    Batch<ASDCP::UL>::operator=
              ((Batch<ASDCP::UL> *)(*(long *)&this->field_0x260 + 0x150),
               (Batch<ASDCP::UL> *)&this->field_0x138);
    ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)&this->m_HeaderPart);
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
         begin(&this->m_EssenceSubDescriptorList);
    while( true ) {
      local_98._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
           end(&this->m_EssenceSubDescriptorList);
      bVar2 = std::operator!=(&local_90,&local_98);
      if (!bVar2) break;
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_90);
      ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)&this->m_HeaderPart);
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_90,0);
    }
    Kumu::UUID::operator=
              ((UUID *)(this->m_FilePackage + 0x150),(UUID *)(this->m_EssenceDescriptor + 0x58));
    UL::~UL((UL *)local_38);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x340,
                "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor(const UL &) [HeaderType = ASDCP::MXF::OP1aHeader]"
               );
}

Assistant:

void AddEssenceDescriptor(const UL& WrappingUL)
	{
	  //
	  // Essence Descriptor
	  //
	  m_EssenceDescriptor->EssenceContainer = WrappingUL;
	  m_HeaderPart.m_Preface->PrimaryPackage = m_FilePackage->InstanceUID;

	  //
	  // Essence Descriptors
	  //
	  assert(m_Dict);
#ifndef ASDCP_GCMULTI_PATCH
	  UL GenericContainerUL(m_Dict->ul(MDD_GCMulti));
	  m_HeaderPart.EssenceContainers.push_back(GenericContainerUL);
#endif

	  if ( m_Info.EncryptedEssence )
	    {
	      UL CryptEssenceUL(m_Dict->ul(MDD_EncryptedContainerLabel));
	      m_HeaderPart.EssenceContainers.push_back(CryptEssenceUL);
	      m_HeaderPart.m_Preface->DMSchemes.push_back(UL(m_Dict->ul(MDD_CryptographicFrameworkLabel)));
	      AddDmsCrypt(m_HeaderPart, *m_FilePackage, m_Info, WrappingUL, m_Dict);
	      //// TODO: fix DMSegment Duration value
	    }
	  else
	    {
	      m_HeaderPart.EssenceContainers.push_back(WrappingUL);
	    }

	  m_HeaderPart.m_Preface->EssenceContainers = m_HeaderPart.EssenceContainers;
	  m_HeaderPart.AddChildObject(m_EssenceDescriptor);

	  std::list<InterchangeObject*>::iterator sdli = m_EssenceSubDescriptorList.begin();
	  for ( ; sdli != m_EssenceSubDescriptorList.end(); sdli++ )
	    m_HeaderPart.AddChildObject(*sdli);

	  m_FilePackage->Descriptor = m_EssenceDescriptor->InstanceUID;
	}